

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O2

Gia_Man_t * Gia_ManBuildGig2(Vec_Int_t *vObjs,Vec_Int_t *vStore,char *pFileName)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Man_t *p_02;
  char *pcVar3;
  Gia_Man_t *pGVar4;
  long lVar5;
  int iVar6;
  
  p = Vec_IntAlloc(vObjs->nSize);
  p_00 = Vec_IntAlloc(vObjs->nSize);
  for (iVar6 = 0; iVar6 < vObjs->nSize; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(vObjs,iVar6);
    iVar1 = Vec_IntEntry(vStore,iVar1);
    Vec_IntPush(p,iVar1);
    iVar1 = Vec_IntEntry(vObjs,iVar6);
    iVar1 = Vec_IntEntry(vStore,iVar1 + 1);
    Vec_IntPush(p_00,iVar1);
  }
  if ((long)p->nSize == 0) {
    iVar6 = 1;
  }
  else {
    iVar6 = *p->pArray;
    for (lVar5 = 1; lVar5 < p->nSize; lVar5 = lVar5 + 1) {
      iVar1 = p->pArray[lVar5];
      if (iVar6 <= iVar1) {
        iVar6 = iVar1;
      }
    }
    iVar6 = iVar6 + 1;
  }
  p_01 = Vec_IntAlloc(iVar6);
  p_01->nSize = iVar6;
  memset(p_01->pArray,0xff,(long)iVar6 << 2);
  Vec_IntWriteEntry(p_01,0,0);
  Vec_IntWriteEntry(p_01,1,1);
  p_02 = Gia_ManStart(vObjs->nSize);
  pcVar3 = Abc_UtilStrsav(pFileName);
  p_02->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(pFileName);
  p_02->pSpec = pcVar3;
  for (iVar6 = 0; iVar1 = vObjs->nSize, iVar6 < iVar1; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(p_00,iVar6);
    if (iVar1 == 2) {
      iVar1 = Vec_IntEntry(p,iVar6);
      iVar2 = Gia_ManAppendCi(p_02);
      Vec_IntWriteEntry(p_01,iVar1,iVar2);
    }
  }
  for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(p_00,iVar6);
    if (iVar1 == 7) {
      iVar1 = Vec_IntEntry(p,iVar6);
      iVar2 = Gia_ManAppendCi(p_02);
      Vec_IntWriteEntry(p_01,iVar1,iVar2);
    }
    iVar1 = vObjs->nSize;
  }
  Gia_ManHashAlloc(p_02);
  for (iVar6 = 0; iVar6 < vObjs->nSize; iVar6 = iVar6 + 1) {
    Vec_IntEntry(p_00,iVar6);
  }
  Vec_IntFree(p_01);
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  pGVar4 = Gia_ManCleanup(p_02);
  Gia_ManStop(p_02);
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManBuildGig2( Vec_Int_t * vObjs, Vec_Int_t * vStore, char * pFileName )
{
    Gia_Man_t * pNew, * pTemp;
    //int * nObjs = Gia_ManGigCount( vObjs, vStore );
    Vec_Int_t * vNets = Vec_IntAlloc( Vec_IntSize(vObjs) );
    Vec_Int_t * vTypes = Vec_IntAlloc( Vec_IntSize(vObjs) );
    Vec_Int_t * vMap;
    int i, Type;
    // connect net IDs
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        Vec_IntPush( vNets, Vec_IntEntry(vStore, Vec_IntEntry(vObjs,i)) );
        Vec_IntPush( vTypes, Vec_IntEntry(vStore, Vec_IntEntry(vObjs,i) + 1) );
    }
    // create mapping for net IDs into GIA IDs
    vMap = Vec_IntStartFull( Vec_IntFindMax(vNets) + 1 ); 
    Vec_IntWriteEntry( vMap, 0, 0 );
    Vec_IntWriteEntry( vMap, 1, 1 );
    // create new manager
    pNew = Gia_ManStart( Vec_IntSize(vObjs) );
    pNew->pName = Abc_UtilStrsav( pFileName );
    pNew->pSpec = Abc_UtilStrsav( pFileName );
    // create primary inputs
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
        if ( Vec_IntEntry(vTypes, i) == GIG_PI )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vNets, i), Gia_ManAppendCi(pNew) );
    // create box outputs
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
        if ( Vec_IntEntry(vTypes, i) == GIG_BOX )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vNets, i), Gia_ManAppendCi(pNew) );
    // create internal nodes
    Gia_ManHashAlloc( pNew );
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        Type = Vec_IntEntry(vTypes, i);
        if ( Type != GIG_LUT && Type != GIG_DELAY && Type != GIG_BAR )
            continue;

    }
    Vec_IntFree( vMap );
    Vec_IntFree( vNets );
    Vec_IntFree( vTypes );
    // rehash
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}